

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDeprecated.cpp
# Opt level: O2

HighsStatus __thiscall Highs::setHighsOptionValue(Highs *this,string *option,bool value)

{
  HighsStatus HVar1;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"setHighsOptionValue",&local_59);
  std::__cxx11::string::string((string *)&local_58,"setOptionValue",&local_5a);
  deprecationMessage(this,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  HVar1 = setOptionValue(this,option,value);
  return HVar1;
}

Assistant:

HighsStatus Highs::setHighsOptionValue(const std::string& option,
                                       const bool value) {
  deprecationMessage("setHighsOptionValue", "setOptionValue");
  return setOptionValue(option, value);
}